

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::maybeFixWritePassword(QPDFJob *this,int R,string *password)

{
  password_mode_e pVar1;
  bool bVar2;
  element_type *peVar3;
  runtime_error *prVar4;
  element_type *peVar5;
  element_type *this_00;
  Pipeline *this_01;
  QPDFLogger local_d0;
  anon_class_1_0_00000001 local_b9;
  function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b8;
  undefined1 local_98 [8];
  string encoded_1;
  string encoded;
  bool local_43;
  bool local_42;
  bool local_41;
  undefined1 local_40 [5];
  bool is_utf16;
  bool is_valid_utf8;
  bool has_8bit_chars;
  string *local_20;
  string *password_local;
  QPDFJob *pQStack_10;
  int R_local;
  QPDFJob *this_local;
  
  local_20 = password;
  password_local._4_4_ = R;
  pQStack_10 = this;
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  pVar1 = peVar3->password_mode;
  if (pVar1 == pm_bytes) {
    QTC::TC("qpdf","QPDFJob password mode bytes",0);
  }
  else if (pVar1 == pm_hex_bytes) {
    QTC::TC("qpdf","QPDFJob password mode hex-bytes",0);
    QUtil::hex_decode((string *)local_40,local_20);
    std::__cxx11::string::operator=((string *)local_20,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  else if ((pVar1 - pm_unicode < 2) &&
          (QUtil::analyze_encoding(local_20,&local_41,&local_42,&local_43), (local_41 & 1U) != 0)) {
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    if (peVar3->password_mode == pm_unicode) {
      if ((local_42 & 1U) == 0) {
        QTC::TC("qpdf","QPDFJob password not unicode",0);
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"supplied password is not valid UTF-8");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (password_local._4_4_ < 5) {
        std::__cxx11::string::string((string *)(encoded_1.field_2._M_local_buf + 8));
        bVar2 = QUtil::utf8_to_pdf_doc(local_20,(string *)(encoded_1.field_2._M_local_buf + 8),'?');
        if (!bVar2) {
          QTC::TC("qpdf","QPDFJob password not encodable",0);
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar4,
                     "supplied password cannot be encoded for 40-bit or 128-bit encryption formats")
          ;
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::__cxx11::string::operator=
                  ((string *)local_20,(string *)(encoded_1.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(encoded_1.field_2._M_local_buf + 8));
      }
    }
    else if ((password_local._4_4_ < 5) && ((local_42 & 1U) != 0)) {
      std::__cxx11::string::string((string *)local_98);
      bVar2 = QUtil::utf8_to_pdf_doc(local_20,(string *)local_98,'?');
      if (bVar2) {
        QTC::TC("qpdf","QPDFJob auto-encode password",0);
        std::function<void(Pipeline&,std::__cxx11::string_const&)>::
        function<QPDFJob::maybeFixWritePassword(int,std::__cxx11::string&)::__0,void>
                  ((function<void(Pipeline&,std::__cxx11::string_const&)> *)&local_b8,&local_b9);
        doIfVerbose(this,&local_b8);
        std::
        function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::~function(&local_b8);
        std::__cxx11::string::operator=((string *)local_20,(string *)local_98);
      }
      else {
        QTC::TC("qpdf","QPDFJob bytes fallback warning",0);
        peVar3 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        peVar5 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)peVar3);
        QPDFLogger::getError(&local_d0,SUB81(peVar5,0));
        this_00 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator*((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_d0);
        peVar3 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        this_01 = Pipeline::operator<<(this_00,&peVar3->message_prefix);
        Pipeline::operator<<
                  (this_01,
                   ": WARNING: supplied password looks like a Unicode password with characters not allowed in passwords for 40-bit and 128-bit encryption; most readers will not be able to open this file with the supplied password. (Use --password-mode=bytes to suppress this warning and use the password anyway.)\n"
                  );
        std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&local_d0);
      }
      std::__cxx11::string::~string((string *)local_98);
    }
    else if ((4 < password_local._4_4_) && ((local_42 & 1U) == 0)) {
      QTC::TC("qpdf","QPDFJob invalid utf-8 in auto",0);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar4,
                 "supplied password is not a valid Unicode password, which is required for 256-bit encryption; to really use this password, rerun with the --password-mode=bytes option"
                );
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void
QPDFJob::maybeFixWritePassword(int R, std::string& password)
{
    switch (m->password_mode) {
    case QPDFJob::pm_bytes:
        QTC::TC("qpdf", "QPDFJob password mode bytes");
        break;

    case QPDFJob::pm_hex_bytes:
        QTC::TC("qpdf", "QPDFJob password mode hex-bytes");
        password = QUtil::hex_decode(password);
        break;

    case QPDFJob::pm_unicode:
    case QPDFJob::pm_auto:
        {
            bool has_8bit_chars;
            bool is_valid_utf8;
            bool is_utf16;
            QUtil::analyze_encoding(password, has_8bit_chars, is_valid_utf8, is_utf16);
            if (!has_8bit_chars) {
                return;
            }
            if (m->password_mode == QPDFJob::pm_unicode) {
                if (!is_valid_utf8) {
                    QTC::TC("qpdf", "QPDFJob password not unicode");
                    throw std::runtime_error("supplied password is not valid UTF-8");
                }
                if (R < 5) {
                    std::string encoded;
                    if (!QUtil::utf8_to_pdf_doc(password, encoded)) {
                        QTC::TC("qpdf", "QPDFJob password not encodable");
                        throw std::runtime_error(
                            "supplied password cannot be encoded for 40-bit "
                            "or 128-bit encryption formats");
                    }
                    password = encoded;
                }
            } else {
                if ((R < 5) && is_valid_utf8) {
                    std::string encoded;
                    if (QUtil::utf8_to_pdf_doc(password, encoded)) {
                        QTC::TC("qpdf", "QPDFJob auto-encode password");
                        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                            v << prefix
                              << ": automatically converting Unicode password to single-byte "
                                 "encoding as required for 40-bit or 128-bit encryption\n";
                        });
                        password = encoded;
                    } else {
                        QTC::TC("qpdf", "QPDFJob bytes fallback warning");
                        *m->log->getError()
                            << m->message_prefix
                            << ": WARNING: supplied password looks like a Unicode password with "
                               "characters not allowed in passwords for 40-bit and 128-bit "
                               "encryption; most readers will not be able to open this file with "
                               "the supplied password. (Use --password-mode=bytes to suppress this "
                               "warning and use the password anyway.)\n";
                    }
                } else if ((R >= 5) && (!is_valid_utf8)) {
                    QTC::TC("qpdf", "QPDFJob invalid utf-8 in auto");
                    throw std::runtime_error(
                        "supplied password is not a valid Unicode password, which is required for "
                        "256-bit encryption; to really use this password, rerun with the "
                        "--password-mode=bytes option");
                }
            }
        }
        break;
    }
}